

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filelist-parser.c
# Opt level: O2

bc_slist_t * blogc_filelist_parse(char *src,size_t src_len)

{
  byte c;
  int iVar1;
  uint uVar2;
  bc_string_t *str;
  char *data;
  bc_slist_t *l;
  ulong uVar3;
  bool bVar4;
  
  str = bc_string_new();
  l = (bc_slist_t *)0x0;
  iVar1 = 1;
  uVar3 = 0;
LAB_00102d99:
  bVar4 = iVar1 == 1;
  do {
    do {
      if (src_len <= uVar3) {
        bc_string_free(str,true);
        return l;
      }
      c = src[uVar3];
      if (!bVar4) {
        if ((c == 10) || (c == 0xd)) {
          if (uVar3 == src_len - 1) goto LAB_00102e01;
        }
        else {
          if (uVar3 != src_len - 1) {
            bc_string_append_c(str,c);
            iVar1 = 2;
            goto LAB_00102de2;
          }
LAB_00102e01:
          if ((c != 10) && (c != 0xd)) {
            bc_string_append_c(str,c);
          }
        }
        data = bc_str_strip(str->str);
        l = bc_slist_append(l,data);
        bc_string_free(str,false);
        str = bc_string_new();
        iVar1 = 1;
        goto LAB_00102de2;
      }
      bVar4 = false;
      uVar2 = (uint)c;
    } while (0x23 < uVar2);
    if ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00102de0;
  } while ((ulong)uVar2 != 0x23);
  for (; uVar3 < src_len; uVar3 = uVar3 + 1) {
    if ((src[uVar3] == '\n') || (src[uVar3] == '\r')) goto LAB_00102de0;
  }
  iVar1 = 1;
  uVar3 = src_len;
  goto LAB_00102de2;
LAB_00102de0:
  iVar1 = 1;
LAB_00102de2:
  uVar3 = uVar3 + 1;
  goto LAB_00102d99;
}

Assistant:

bc_slist_t*
blogc_filelist_parse(const char *src, size_t src_len)
{
    size_t current = 0;
    bc_slist_t *rv = NULL;
    bc_string_t *line = bc_string_new();
    blogc_filelist_parser_state_t state = LINE_START;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        switch (state) {

            case LINE_START:
                if (c == '#') {
                    while (current < src_len) {
                        if (src[current] == '\r' || src[current] == '\n')
                            break;
                        current++;
                    }
                    break;
                }
                if (c == ' ' || c == '\t' || c == '\r' || c == '\n')
                    break;
                state = LINE;
                continue;

            case LINE:
                if (c == '\r' || c == '\n' || is_last) {
                    if (is_last && c != '\r' && c != '\n')
                        bc_string_append_c(line, c);
                    rv = bc_slist_append(rv, bc_str_strip(line->str));
                    bc_string_free(line, false);
                    line = bc_string_new();
                    state = LINE_START;
                    break;
                }
                bc_string_append_c(line, c);
                break;

        }

        current++;
    }

    bc_string_free(line, true);

    return rv;
}